

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  const_iterator cVar5;
  long *plVar6;
  const_iterator cVar7;
  _Base_ptr p_Var8;
  ulong *puVar9;
  size_type *psVar10;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  pointer ppVar13;
  _Alloc_hider _Var14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  ulong uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  String *local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  _Base_ptr local_108;
  undefined2 *local_100;
  ulong local_f8;
  undefined2 local_f0;
  undefined1 local_ee;
  undefined1 *local_e0;
  ulong local_d8;
  undefined1 local_d0 [16];
  _Base_ptr local_c0;
  Options *local_b8;
  pointer local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_38;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_b8 = this;
  if ((_Rb_tree_header *)cVar5._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar18 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar18;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_178 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_128," ",g);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
      paVar1 = &local_198.field_2;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_198.field_2._M_allocated_capacity = *puVar9;
        local_198.field_2._8_8_ = plVar6[3];
        local_198._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_198.field_2._M_allocated_capacity = *puVar9;
        local_198._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_170.first._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      paVar2 = &local_170.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar1) {
        local_170.first.field_2._8_8_ = local_198.field_2._8_8_;
        local_198._M_dataplus._M_p = (pointer)paVar2;
      }
      local_170.first.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
      local_198._M_string_length = 0;
      local_198.field_2._M_allocated_capacity =
           local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_170.first._M_dataplus._M_p = local_198._M_dataplus._M_p;
      local_198._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_170.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_170.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
    p_Var15 = *(_Base_ptr *)(cVar5._M_node + 4);
    local_108 = cVar5._M_node[4]._M_parent;
    local_130 = paVar18;
    local_c0 = cVar5._M_node;
    if (p_Var15 != local_108) {
      local_80 = &(local_b8->m_positional_set)._M_h;
      paVar18 = &local_170.second.field_2;
      uVar17 = 0;
      do {
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find(local_80,(key_type *)(p_Var15 + 1));
        if ((cVar7.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0) || (local_b8->m_show_positional != false)) {
          local_100 = &local_f0;
          local_f0 = 0x2020;
          local_f8 = 2;
          local_ee = 0;
          if (p_Var15->_M_parent == (_Base_ptr)0x0) {
            std::__cxx11::string::append((char *)&local_100);
          }
          else {
            std::operator+(&local_198,"-",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var15);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
            local_170.first._M_dataplus._M_p = (pointer)&local_170.first.field_2;
            puVar9 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar9) {
              local_170.first.field_2._M_allocated_capacity = *puVar9;
              local_170.first.field_2._8_8_ = plVar6[3];
            }
            else {
              local_170.first.field_2._M_allocated_capacity = *puVar9;
              local_170.first._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_170.first._M_string_length = plVar6[1];
            *plVar6 = (long)puVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_100,(ulong)local_170.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
              operator_delete(local_170.first._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
          }
          if (p_Var15[1]._M_parent != (_Base_ptr)0x0) {
            std::operator+(&local_170.first," --",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var15 + 1));
            std::__cxx11::string::_M_append
                      ((char *)&local_100,(ulong)local_170.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
              operator_delete(local_170.first._M_dataplus._M_p);
            }
          }
          local_170.first._M_dataplus._M_p = (pointer)&local_170.first.field_2;
          if (p_Var15[5]._M_right == (_Base_ptr)0x0) {
            local_170.first._M_string_length = 3;
            local_170.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,p_Var15[5]._M_left,
                       (long)&(p_Var15[5]._M_left)->_M_color +
                       (long)&(p_Var15[5]._M_right)->_M_color);
          }
          if (*(char *)((long)&p_Var15[6]._M_left + 1) == '\0') {
            if (*(char *)&p_Var15[4]._M_parent == '\x01') {
              std::operator+(&local_78," [=",&local_170.first);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              psVar10 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_a8.field_2._M_allocated_capacity = *psVar10;
                local_a8.field_2._8_8_ = plVar6[3];
              }
              else {
                local_a8.field_2._M_allocated_capacity = *psVar10;
                local_a8._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_a8._M_string_length = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a8,(ulong)p_Var15[4]._M_left);
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              puVar9 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar9) {
                local_128.field_2._M_allocated_capacity = *puVar9;
                local_128.field_2._8_8_ = plVar6[3];
              }
              else {
                local_128.field_2._M_allocated_capacity = *puVar9;
                local_128._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_128._M_string_length = plVar6[1];
              *plVar6 = (long)puVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              puVar9 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar9) {
                local_198.field_2._M_allocated_capacity = *puVar9;
                local_198.field_2._8_8_ = plVar6[3];
              }
              else {
                local_198.field_2._M_allocated_capacity = *puVar9;
                local_198._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_198._M_string_length = plVar6[1];
              *plVar6 = (long)puVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_198._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              pbVar3 = &local_78;
              _Var11._M_p = local_78._M_dataplus._M_p;
            }
            else {
              std::operator+(&local_198," ",&local_170.first);
              std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_198._M_dataplus._M_p);
              pbVar3 = &local_198;
              _Var11._M_p = local_198._M_dataplus._M_p;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var11._M_p != &pbVar3->field_2) {
              operator_delete(_Var11._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
            operator_delete(local_170.first._M_dataplus._M_p);
          }
          if (uVar17 <= local_f8) {
            uVar17 = local_f8;
          }
          paVar1 = &local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_allocated_capacity =
               local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_170.first._M_dataplus._M_p = (pointer)&local_170.first.field_2;
          local_198._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,local_100,local_f8 + (long)local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p == paVar1) {
            local_170.second.field_2._8_8_ = local_198.field_2._8_8_;
            local_170.second._M_dataplus._M_p = (pointer)paVar18;
          }
          else {
            local_170.second._M_dataplus._M_p = local_198._M_dataplus._M_p;
          }
          local_170.second.field_2._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
          local_170.second._M_string_length = local_198._M_string_length;
          local_198._M_string_length = 0;
          local_198.field_2._M_allocated_capacity =
               local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_198._M_dataplus._M_p = (pointer)paVar1;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_58,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170.second._M_dataplus._M_p != paVar18) {
            operator_delete(local_170.second._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170.first._M_dataplus._M_p != &local_170.first.field_2) {
            operator_delete(local_170.first._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if (local_100 != &local_f0) {
            operator_delete(local_100);
          }
        }
        p_Var15 = (_Base_ptr)&p_Var15[6]._M_right;
      } while (p_Var15 != local_108);
      p_Var15 = *(_Base_ptr *)(local_c0 + 4);
      local_38 = local_c0[4]._M_parent;
      local_88 = 0x1e;
      if (uVar17 < 0x1e) {
        local_88 = uVar17;
      }
      __return_storage_ptr__ = local_178;
      if (p_Var15 != local_38) {
        p_Var16 = (_Base_ptr)(0x4a - local_88);
        local_108 = (_Base_ptr)(local_88 + 2);
        ppVar13 = local_58.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c0 = p_Var16;
        do {
          paVar18 = &local_128.field_2;
          cVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(local_80,(key_type *)(p_Var15 + 1));
          if ((cVar7.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur == (__node_type *)0x0) || (local_b8->m_show_positional != false)) {
            local_170.first._M_dataplus._M_p = (pointer)&local_170.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_170,*(long *)(p_Var15 + 2),
                       (long)&(p_Var15[2]._M_parent)->_M_color + *(long *)(p_Var15 + 2));
            if (((char)p_Var15[3]._M_color == _S_black) &&
               ((*(char *)((long)&p_Var15[6]._M_left + 1) != '\x01' ||
                (iVar4 = std::__cxx11::string::compare((char *)&p_Var15[3]._M_parent), iVar4 != 0)))
               ) {
              std::operator+(&local_a8," (default: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var15[3]._M_parent);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
              puVar9 = (ulong *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar9) {
                local_128.field_2._M_allocated_capacity = *puVar9;
                local_128.field_2._8_8_ = plVar6[3];
                local_128._M_dataplus._M_p = (pointer)paVar18;
              }
              else {
                local_128.field_2._M_allocated_capacity = *puVar9;
                local_128._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_198._M_string_length = plVar6[1];
              *plVar6 = (long)puVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p == paVar18) {
                local_198.field_2._8_8_ = local_128.field_2._8_8_;
                local_128._M_dataplus._M_p = (pointer)&local_198.field_2;
              }
              local_198.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
              local_128._M_string_length = 0;
              local_128.field_2._M_allocated_capacity =
                   local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_198._M_dataplus._M_p = local_128._M_dataplus._M_p;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_128._M_dataplus._M_p;
              local_128._M_dataplus._M_p = (pointer)paVar18;
              std::__cxx11::string::_M_append((char *)&local_170,(ulong)paVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != paVar18) {
                operator_delete(local_128._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
            }
            local_e0 = local_d0;
            local_d8 = 0;
            local_d0[0] = 0;
            _Var11._M_p = local_170.first._M_dataplus._M_p;
            local_b0 = ppVar13;
            if (local_170.first._M_string_length != 0) {
              p_Var8 = (_Base_ptr)0x0;
              _Var12._M_p = local_170.first._M_dataplus._M_p;
              _Var14._M_p = local_170.first._M_dataplus._M_p;
              do {
                if (*_Var12._M_p == '\n') {
                  _Var11._M_p = _Var12._M_p + 1;
                  _Var14._M_p = _Var11._M_p;
                }
                else {
                  if (*_Var12._M_p == ' ') {
                    _Var14._M_p = _Var12._M_p;
                  }
                  if (p_Var16 < p_Var8) {
                    if (_Var14._M_p == _Var11._M_p) {
                      std::__cxx11::string::replace
                                ((ulong)&local_e0,local_d8,(char *)0x0,(ulong)_Var11._M_p);
                      paVar18 = &local_78.field_2;
                      local_78.field_2._M_allocated_capacity._0_2_ = 10;
                      local_78._M_string_length = 1;
                      local_78._M_dataplus._M_p = (pointer)paVar18;
                      std::__cxx11::string::_M_append((char *)&local_e0,(ulong)paVar18);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_78._M_dataplus._M_p != paVar18) {
                        operator_delete(local_78._M_dataplus._M_p);
                      }
                      std::__cxx11::string::_M_replace_aux
                                ((ulong)&local_e0,local_d8,0,(char)local_108);
                      _Var11._M_p = _Var12._M_p + 1;
                      _Var14._M_p = _Var11._M_p;
                    }
                    else {
                      std::__cxx11::string::replace
                                ((ulong)&local_e0,local_d8,(char *)0x0,(ulong)_Var11._M_p);
                      local_f0 = 10;
                      local_f8 = 1;
                      local_100 = &local_f0;
                      std::__cxx11::string::_M_append((char *)&local_e0,(ulong)&local_f0);
                      if (local_100 != &local_f0) {
                        operator_delete(local_100);
                      }
                      std::__cxx11::string::_M_replace_aux
                                ((ulong)&local_e0,local_d8,0,(char)local_108);
                      _Var11._M_p = _Var14._M_p + 1;
                    }
                    p_Var8 = (_Base_ptr)0x0;
                    p_Var16 = local_c0;
                  }
                  else {
                    p_Var8 = (_Base_ptr)((long)&p_Var8->_M_color + 1);
                  }
                }
                _Var12._M_p = _Var12._M_p + 1;
              } while (_Var12._M_p !=
                       local_170.first._M_dataplus._M_p + local_170.first._M_string_length);
            }
            __return_storage_ptr__ = local_178;
            paVar18 = &local_170.first.field_2;
            std::__cxx11::string::replace((ulong)&local_e0,local_d8,(char *)0x0,(ulong)_Var11._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170.first._M_dataplus._M_p != paVar18) {
              operator_delete(local_170.first._M_dataplus._M_p);
            }
            ppVar13 = local_b0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)(local_b0->first)._M_dataplus._M_p);
            uVar17 = (ppVar13->first)._M_string_length;
            if (local_88 < uVar17) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              paVar18 = &local_198.field_2;
              local_198._M_dataplus._M_p = (pointer)paVar18;
              std::__cxx11::string::_M_construct((ulong)&local_198,(char)local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p == paVar18) {
                local_170.first.field_2._8_8_ = local_198.field_2._8_8_;
                local_198._M_dataplus._M_p = (pointer)&local_170.first.field_2;
              }
              local_170.first.field_2._M_allocated_capacity =
                   local_198.field_2._M_allocated_capacity;
              local_170.first._M_string_length = local_198._M_string_length;
              local_198._M_string_length = 0;
              local_198.field_2._M_allocated_capacity =
                   local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_170.first._M_dataplus._M_p = local_198._M_dataplus._M_p;
              local_198._M_dataplus._M_p = (pointer)paVar18;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_170.first._M_dataplus._M_p);
              bVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_170.first._M_dataplus._M_p == &local_170.first.field_2;
            }
            else {
              paVar1 = &local_198.field_2;
              local_198._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_198,(char)local_108 - (char)uVar17);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p == paVar1) {
                local_170.first.field_2._8_8_ = local_198.field_2._8_8_;
                local_198._M_dataplus._M_p = (pointer)paVar18;
              }
              local_170.first.field_2._M_allocated_capacity =
                   local_198.field_2._M_allocated_capacity;
              local_170.first._M_string_length = local_198._M_string_length;
              local_198._M_string_length = 0;
              local_198.field_2._M_allocated_capacity =
                   local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_170.first._M_dataplus._M_p = local_198._M_dataplus._M_p;
              local_198._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_170.first._M_dataplus._M_p);
              bVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_170.first._M_dataplus._M_p == paVar18;
            }
            ppVar13 = local_b0;
            if (!bVar19) {
              operator_delete(local_170.first._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e0);
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            if (local_e0 != local_d0) {
              operator_delete(local_e0);
            }
            ppVar13 = ppVar13 + 1;
          }
          p_Var15 = (_Base_ptr)&p_Var15[6]._M_right;
        } while (p_Var15 != local_38);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String Options::help_one_group(const std::string &g) const {
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end()) {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty()) {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto &o : group->second.options) {
    if (m_positional_set.find(o.l) != m_positional_set.end() &&
        !m_show_positional) {
      continue;
    }

    auto s = format_option(o);
    longest = (std::max)(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = (std::min)(longest, static_cast<size_t>(OPTION_LONGEST));

  // widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto &o : group->second.options) {
    if (m_positional_set.find(o.l) != m_positional_set.end() &&
        !m_show_positional) {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest) {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    } else {
      result += toLocalString(std::string(
          longest + OPTION_DESC_GAP - stringLength(fiter->first), ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}